

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascRootFile_MNDX.cpp
# Opt level: O0

int __thiscall
TMndxMarFile::LoadRootData
          (TMndxMarFile *this,FILE_MAR_INFO *MarInfo,LPBYTE pbRootFile,LPBYTE pbRootEnd)

{
  LPBYTE pBVar1;
  TFileNameDatabase *this_00;
  LPBYTE pbRootEnd_local;
  LPBYTE pbRootFile_local;
  FILE_MAR_INFO *MarInfo_local;
  TMndxMarFile *this_local;
  
  pBVar1 = (LPBYTE)malloc((ulong)MarInfo->MarDataSize);
  this->pbMarData = pBVar1;
  this->cbMarData = (ulong)MarInfo->MarDataSize;
  if (this->pbMarData == (LPBYTE)0x0) {
    this_local._4_4_ = 0xc;
  }
  else {
    pBVar1 = CaptureData(pbRootFile + MarInfo->MarDataOffset,pbRootEnd,this->pbMarData,
                         this->cbMarData);
    if (pBVar1 == (LPBYTE)0x0) {
      this_local._4_4_ = 0x3ec;
    }
    else {
      this_00 = (TFileNameDatabase *)operator_new(0x248);
      TFileNameDatabase::TFileNameDatabase(this_00);
      this->pDatabase = this_00;
      if (this->pDatabase == (TFileNameDatabase *)0x0) {
        this_local._4_4_ = 0xc;
      }
      else {
        this_local._4_4_ =
             TFileNameDatabase::CreateDatabase(this->pDatabase,this->pbMarData,this->cbMarData);
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

int LoadRootData(FILE_MAR_INFO & MarInfo, LPBYTE pbRootFile, LPBYTE pbRootEnd)
    {
        // Allocate the MAR data
        pbMarData = CASC_ALLOC(BYTE, MarInfo.MarDataSize);
        cbMarData = MarInfo.MarDataSize;
        if(pbMarData == NULL)
            return ERROR_NOT_ENOUGH_MEMORY;

        // Capture the MAR data
        if(!CaptureData(pbRootFile + MarInfo.MarDataOffset, pbRootEnd, pbMarData, cbMarData))
            return ERROR_FILE_CORRUPT;

        // Create the file name database
        pDatabase = new TFileNameDatabase();
        if(pDatabase == NULL)
            return ERROR_NOT_ENOUGH_MEMORY;

        return pDatabase->CreateDatabase(pbMarData, cbMarData);
    }